

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O2

DecodeStatus DecodeL5RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Op3_00;
  uint Op5;
  uint Op4;
  uint Op3;
  uint Op2;
  uint Op1;
  
  Op3_00 = &Op3;
  DVar1 = Decode3OpInstruction(Insn & 0xffff,&Op1,&Op2,Op3_00);
  if (DVar1 == MCDisassembler_Success) {
    DVar1 = Decode2OpInstruction(Insn >> 0x10,&Op4,&Op5);
    if (DVar1 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass(Inst,Op1,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,Op4,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,Op2,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,Op3,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,Op5,Address,Op3_00);
      return MCDisassembler_Success;
    }
  }
  DVar1 = DecodeL5RInstructionFail(Inst,Insn,Address,Op3_00);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL5RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	S = Decode2OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	return S;
}